

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helpers.h
# Opt level: O0

void __thiscall clean_up_fixture::clean_up_fixture(clean_up_fixture *this)

{
  path local_70;
  path local_50;
  path local_30;
  clean_up_fixture *local_10;
  clean_up_fixture *this_local;
  
  local_10 = this;
  boost::filesystem::temp_directory_path();
  boost::filesystem::path::path(&local_70,"%%%%-%%%%-%%%%-%%%%");
  boost::filesystem::unique_path(&local_50,&local_70);
  boost::filesystem::operator/(&this->m_path,&local_30,&local_50);
  boost::filesystem::path::~path(&local_50);
  boost::filesystem::path::~path(&local_70);
  boost::filesystem::path::~path(&local_30);
  return;
}

Assistant:

clean_up_fixture()
        : m_path(fs::temp_directory_path() / fs::unique_path()) {}